

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O1

void __thiscall re2c::Cases::emit(Cases *this,OutputFile *o,uint32_t ind,bool *readCh)

{
  OutputFile *pOVar1;
  bool *readCh_00;
  ulong uVar2;
  long lVar3;
  string local_50;
  
  pOVar1 = OutputFile::wind(o,ind);
  pOVar1 = OutputFile::ws(pOVar1,"switch (");
  output_yych_abi_cxx11_(&local_50,(re2c *)readCh,readCh_00);
  pOVar1 = OutputFile::wstring(pOVar1,&local_50);
  OutputFile::ws(pOVar1,") {\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (this->cases_size != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      if (*(State **)((long)&this->cases->to + lVar3) != this->def) {
        Case::emit((Case *)((long)&(this->cases->ranges).
                                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar3),o,ind);
        output_goto(o,1,readCh,(label_t)**(uint32_t **)((long)&this->cases->to + lVar3));
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar2 < this->cases_size);
  }
  pOVar1 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar1,"default:");
  output_goto(o,1,readCh,(label_t)(this->def->label).value);
  pOVar1 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar1,"}\n");
  return;
}

Assistant:

void Cases::emit (OutputFile & o, uint32_t ind, bool & readCh)
{
	o.wind(ind).ws("switch (").wstring(output_yych (readCh)).ws(") {\n");
	for (uint32_t i = 0; i < cases_size; ++i)
	{
		if (cases[i].to != def)
		{
			cases[i].emit (o, ind);
			output_goto (o, 1, readCh, cases[i].to->label);
		}
	}
	o.wind(ind).ws("default:");
	output_goto (o, 1, readCh, def->label);
	o.wind(ind).ws("}\n");
}